

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

file_status __thiscall
boost::filesystem::detail::symlink_status(detail *this,path *p,error_code *ec)

{
  __syscall_slong_t this_00;
  int iVar1;
  perms pVar2;
  value_type *__file;
  int *piVar3;
  error_category *peVar4;
  filesystem_error *this_01;
  error_code ec_00;
  error_code local_f8 [2];
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  stat path_stat;
  error_code *ec_local;
  path *p_local;
  
  path_stat.__glibc_reserved[2] = (__syscall_slong_t)ec;
  __file = filesystem::path::c_str(p);
  iVar1 = lstat64(__file,(stat64 *)local_b0);
  this_00 = path_stat.__glibc_reserved[2];
  if (iVar1 == 0) {
    if (path_stat.__glibc_reserved[2] != 0) {
      system::error_code::clear((error_code *)path_stat.__glibc_reserved[2]);
    }
    if (((perms)path_stat.st_nlink & 0xf000) == 0x8000) {
      pVar2 = operator&((perms)path_stat.st_nlink,perms_mask);
      file_status::file_status((file_status *)this,regular_file,pVar2);
    }
    else if (((perms)path_stat.st_nlink & 0xf000) == symlink_perms) {
      pVar2 = operator&((perms)path_stat.st_nlink,perms_mask);
      file_status::file_status((file_status *)this,directory_file,pVar2);
    }
    else if (((perms)path_stat.st_nlink & 0xf000) == 0xa000) {
      pVar2 = operator&((perms)path_stat.st_nlink,perms_mask);
      file_status::file_status((file_status *)this,symlink_file,pVar2);
    }
    else if (((perms)path_stat.st_nlink & 0xf000) == (symlink_perms|remove_perms)) {
      pVar2 = operator&((perms)path_stat.st_nlink,perms_mask);
      file_status::file_status((file_status *)this,block_file,pVar2);
    }
    else if (((perms)path_stat.st_nlink & 0xf000) == remove_perms) {
      pVar2 = operator&((perms)path_stat.st_nlink,perms_mask);
      file_status::file_status((file_status *)this,character_file,pVar2);
    }
    else if (((perms)path_stat.st_nlink & 0xf000) == add_perms) {
      pVar2 = operator&((perms)path_stat.st_nlink,perms_mask);
      file_status::file_status((file_status *)this,fifo_file,pVar2);
    }
    else if (((perms)path_stat.st_nlink & 0xf000) == 0xc000) {
      pVar2 = operator&((perms)path_stat.st_nlink,perms_mask);
      file_status::file_status((file_status *)this,socket_file,pVar2);
    }
    else {
      file_status::file_status((file_status *)this,type_unknown);
    }
  }
  else {
    if (path_stat.__glibc_reserved[2] != 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      peVar4 = system::system_category();
      system::error_code::assign((error_code *)this_00,iVar1,peVar4);
    }
    piVar3 = __errno_location();
    if ((*piVar3 != 2) && (piVar3 = __errno_location(), *piVar3 != 0x14)) {
      if (path_stat.__glibc_reserved[2] != 0) {
        file_status::file_status((file_status *)this,status_error);
        return (file_status)this;
      }
      this_01 = (filesystem_error *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"boost::filesystem::status",&local_d1);
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      peVar4 = system::system_category();
      system::error_code::error_code(local_f8,iVar1,peVar4);
      ec_00._4_4_ = 0;
      ec_00.m_val = local_f8[0].m_val;
      ec_00.m_cat = local_f8[0].m_cat;
      filesystem_error::filesystem_error(this_01,&local_d0,p,ec_00);
      __cxa_throw(this_01,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    file_status::file_status((file_status *)this,file_not_found,no_perms);
  }
  return (file_status)this;
}

Assistant:

BOOST_FILESYSTEM_DECL
  file_status symlink_status(const path& p, error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (::lstat(p.c_str(), &path_stat)!= 0)
    {
      if (ec != 0)                            // always report errno, even though some
        ec->assign(errno, system_category());   // errno values are not status_errors

      if (errno == ENOENT || errno == ENOTDIR) // these are not errors
      {
        return fs::file_status(fs::file_not_found, fs::no_perms);
      }
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error("boost::filesystem::status",
          p, error_code(errno, system_category())));
      return fs::file_status(fs::status_error);
    }
    if (ec != 0) ec->clear();
    if (S_ISREG(path_stat.st_mode))
      return fs::file_status(fs::regular_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISDIR(path_stat.st_mode))
      return fs::file_status(fs::directory_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISLNK(path_stat.st_mode))
      return fs::file_status(fs::symlink_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISBLK(path_stat.st_mode))
      return fs::file_status(fs::block_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISCHR(path_stat.st_mode))
      return fs::file_status(fs::character_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISFIFO(path_stat.st_mode))
      return fs::file_status(fs::fifo_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISSOCK(path_stat.st_mode))
      return fs::file_status(fs::socket_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    return fs::file_status(fs::type_unknown);

#   else  // Windows

    DWORD attr(::GetFileAttributesW(p.c_str()));
    if (attr == 0xFFFFFFFF)
    {
      return process_status_failure(p, ec);
    }

    if (ec != 0) ec->clear();

    if (attr & FILE_ATTRIBUTE_REPARSE_POINT)
      return is_reparse_point_a_symlink(p)
             ? file_status(symlink_file, make_permissions(p, attr))
             : file_status(reparse_file, make_permissions(p, attr));

    return (attr & FILE_ATTRIBUTE_DIRECTORY)
      ? file_status(directory_file, make_permissions(p, attr))
      : file_status(regular_file, make_permissions(p, attr));

#   endif
  }